

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cfg.cpp
# Opt level: O0

bool __thiscall
diligent_spirv_cross::CFG::node_terminates_control_flow_in_sub_graph
          (CFG *this,BlockID from,BlockID to)

{
  Compiler *pCVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  SPIRBlock *pSVar5;
  pointer pvVar6;
  bool local_e1;
  bool local_d1;
  TypedID<(diligent_spirv_cross::Types)6> local_ac;
  SPIRBlock *local_a8;
  SPIRBlock *ignore_block;
  SPIRBlock *false_block;
  SPIRBlock *true_block;
  bool merges_to_nothing;
  bool false_path_ignore;
  SPIRBlock *pSStack_88;
  bool true_path_ignore;
  SPIRBlock *dom;
  uint *puStack_78;
  uint32_t dominator;
  uint *edge;
  uint *__end2;
  uint *__begin2;
  SmallVector<unsigned_int,_8UL> *__range2;
  DominatorBuilder builder;
  uint32_t local_3c;
  _Node_iterator_base<std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
  local_38;
  const_iterator pred_itr;
  BlockID ignore_block_id;
  SPIRBlock *from_block;
  CFG *this_local;
  uint32_t local_10;
  BlockID to_local;
  BlockID from_local;
  
  pCVar1 = this->compiler;
  this_local._4_4_ = to.id;
  local_10 = from.id;
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_10);
  pSVar5 = Compiler::get<diligent_spirv_cross::SPIRBlock>(pCVar1,uVar3);
  TypedID<(diligent_spirv_cross::Types)6>::TypedID
            ((TypedID<(diligent_spirv_cross::Types)6> *)
             ((long)&pred_itr.
                     super__Node_iterator_base<std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
                     ._M_cur + 4),0);
  if (pSVar5->merge == MergeLoop) {
    pred_itr.
    super__Node_iterator_base<std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
    ._M_cur._4_4_ = (pSVar5->merge_block).id;
  }
  do {
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_10);
    if (uVar3 == uVar4) {
      return true;
    }
    local_3c = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
    local_38._M_cur =
         (__node_type *)
         ::std::
         unordered_map<unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>_>_>
         ::find(&this->preceding_edges,&local_3c);
    builder._8_8_ =
         ::std::
         end<std::unordered_map<unsigned_int,diligent_spirv_cross::SmallVector<unsigned_int,8ul>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,diligent_spirv_cross::SmallVector<unsigned_int,8ul>>>>>
                   (&this->preceding_edges);
    bVar2 = ::std::__detail::operator==
                      (&local_38,
                       (_Node_iterator_base<std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
                        *)&builder.dominator);
    if (bVar2) {
      return false;
    }
    DominatorBuilder::DominatorBuilder((DominatorBuilder *)&__range2,this);
    pvVar6 = ::std::__detail::
             _Node_const_iterator<std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false,_false>
             ::operator->((_Node_const_iterator<std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false,_false>
                           *)&local_38);
    __begin2 = (uint *)&pvVar6->second;
    __end2 = VectorView<unsigned_int>::begin((VectorView<unsigned_int> *)__begin2);
    edge = VectorView<unsigned_int>::end((VectorView<unsigned_int> *)__begin2);
    for (; __end2 != edge; __end2 = __end2 + 1) {
      puStack_78 = __end2;
      DominatorBuilder::add_block((DominatorBuilder *)&__range2,*__end2);
    }
    dom._4_4_ = DominatorBuilder::get_dominator((DominatorBuilder *)&__range2);
    if (dom._4_4_ == 0) {
      return false;
    }
    pSStack_88 = Compiler::get<diligent_spirv_cross::SPIRBlock>(this->compiler,dom._4_4_);
    true_block._7_1_ = 0;
    true_block._6_1_ = 0;
    local_d1 = true;
    if (pSStack_88->merge != MergeNone) {
      if ((pSStack_88->merge == MergeSelection) &&
         (uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_88->next_block),
         uVar3 != 0)) {
        pCVar1 = this->compiler;
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_88->next_block);
        pSVar5 = Compiler::get<diligent_spirv_cross::SPIRBlock>(pCVar1,uVar3);
        local_d1 = true;
        if (*(int *)&(pSVar5->super_IVariant).field_0xc == 5) goto LAB_00deef7b;
      }
      local_e1 = false;
      if (pSStack_88->merge == MergeLoop) {
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_88->merge_block);
        local_e1 = false;
        if (uVar3 != 0) {
          pCVar1 = this->compiler;
          uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_88->merge_block);
          pSVar5 = Compiler::get<diligent_spirv_cross::SPIRBlock>(pCVar1,uVar3);
          local_e1 = *(int *)&(pSVar5->super_IVariant).field_0xc == 5;
        }
      }
      local_d1 = local_e1;
    }
LAB_00deef7b:
    true_block._5_1_ = local_d1;
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_88->super_IVariant).self);
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_10);
    if ((((uVar3 == uVar4) || ((true_block._5_1_ & 1) != 0)) &&
        (uVar3 = TypedID::operator_cast_to_unsigned_int
                           ((TypedID *)
                            ((long)&pred_itr.
                                    super__Node_iterator_base<std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
                                    ._M_cur + 4)), uVar3 != 0)) &&
       (*(int *)&(pSStack_88->super_IVariant).field_0xc == 2)) {
      pCVar1 = this->compiler;
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_88->true_block);
      false_block = Compiler::get<diligent_spirv_cross::SPIRBlock>(pCVar1,uVar3);
      pCVar1 = this->compiler;
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_88->false_block);
      ignore_block = Compiler::get<diligent_spirv_cross::SPIRBlock>(pCVar1,uVar3);
      pCVar1 = this->compiler;
      uVar3 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)
                         ((long)&pred_itr.
                                 super__Node_iterator_base<std::pair<const_unsigned_int,_diligent_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
                                 ._M_cur + 4));
      local_a8 = Compiler::get<diligent_spirv_cross::SPIRBlock>(pCVar1,uVar3);
      true_block._7_1_ = Compiler::execution_is_branchless(this->compiler,false_block,local_a8);
      true_block._6_1_ = Compiler::execution_is_branchless(this->compiler,ignore_block,local_a8);
    }
    if (pSStack_88->merge == MergeSelection) {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_88->next_block);
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
      if (uVar3 != uVar4) goto LAB_00def101;
    }
    else {
LAB_00def101:
      if (pSStack_88->merge == MergeLoop) {
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_88->merge_block);
        uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
        if (uVar3 == uVar4) goto LAB_00def1df;
      }
      if (*(int *)&(pSStack_88->super_IVariant).field_0xc == 1) {
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_88->next_block);
        uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
        if (uVar3 == uVar4) goto LAB_00def1df;
      }
      if (*(int *)&(pSStack_88->super_IVariant).field_0xc == 2) {
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_88->true_block);
        uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
        if ((uVar3 == uVar4) && ((true_block._6_1_ & 1) != 0)) goto LAB_00def1df;
      }
      if (*(int *)&(pSStack_88->super_IVariant).field_0xc != 2) {
        return false;
      }
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_88->false_block);
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
      if (uVar3 != uVar4) {
        return false;
      }
      if ((true_block._7_1_ & 1) == 0) {
        return false;
      }
    }
LAB_00def1df:
    TypedID<(diligent_spirv_cross::Types)6>::TypedID(&local_ac,dom._4_4_);
    this_local._4_4_ = local_ac.id;
  } while( true );
}

Assistant:

bool CFG::node_terminates_control_flow_in_sub_graph(BlockID from, BlockID to) const
{
	// Walk backwards, starting from "to" block.
	// Only follow pred edges if they have a 1:1 relationship, or a merge relationship.
	// If we cannot find a path to "from", we must assume that to is inside control flow in some way.

	auto &from_block = compiler.get<SPIRBlock>(from);
	BlockID ignore_block_id = 0;
	if (from_block.merge == SPIRBlock::MergeLoop)
		ignore_block_id = from_block.merge_block;

	while (to != from)
	{
		auto pred_itr = preceding_edges.find(to);
		if (pred_itr == end(preceding_edges))
			return false;

		DominatorBuilder builder(*this);
		for (auto &edge : pred_itr->second)
			builder.add_block(edge);

		uint32_t dominator = builder.get_dominator();
		if (dominator == 0)
			return false;

		auto &dom = compiler.get<SPIRBlock>(dominator);

		bool true_path_ignore = false;
		bool false_path_ignore = false;

		bool merges_to_nothing = dom.merge == SPIRBlock::MergeNone ||
		                         (dom.merge == SPIRBlock::MergeSelection && dom.next_block &&
		                          compiler.get<SPIRBlock>(dom.next_block).terminator == SPIRBlock::Unreachable) ||
		                         (dom.merge == SPIRBlock::MergeLoop && dom.merge_block &&
		                          compiler.get<SPIRBlock>(dom.merge_block).terminator == SPIRBlock::Unreachable);

		if (dom.self == from || merges_to_nothing)
		{
			// We can only ignore inner branchy paths if there is no merge,
			// i.e. no code is generated afterwards. E.g. this allows us to elide continue:
			// for (;;) { if (cond) { continue; } else { break; } }.
			// Codegen here in SPIR-V will be something like either no merge if one path directly breaks, or
			// we merge to Unreachable.
			if (ignore_block_id && dom.terminator == SPIRBlock::Select)
			{
				auto &true_block = compiler.get<SPIRBlock>(dom.true_block);
				auto &false_block = compiler.get<SPIRBlock>(dom.false_block);
				auto &ignore_block = compiler.get<SPIRBlock>(ignore_block_id);
				true_path_ignore = compiler.execution_is_branchless(true_block, ignore_block);
				false_path_ignore = compiler.execution_is_branchless(false_block, ignore_block);
			}
		}

		// Cases where we allow traversal. This serves as a proxy for post-dominance in a loop body.
		// TODO: Might want to do full post-dominance analysis, but it's a lot of churn for something like this ...
		// - We're the merge block of a selection construct. Jump to header.
		// - We're the merge block of a loop. Jump to header.
		// - Direct branch. Trivial.
		// - Allow cases inside a branch if the header cannot merge execution before loop exit.
		if ((dom.merge == SPIRBlock::MergeSelection && dom.next_block == to) ||
		    (dom.merge == SPIRBlock::MergeLoop && dom.merge_block == to) ||
		    (dom.terminator == SPIRBlock::Direct && dom.next_block == to) ||
		    (dom.terminator == SPIRBlock::Select && dom.true_block == to && false_path_ignore) ||
		    (dom.terminator == SPIRBlock::Select && dom.false_block == to && true_path_ignore))
		{
			// Allow walking selection constructs if the other branch reaches out of a loop construct.
			// It cannot be in-scope anymore.
			to = dominator;
		}
		else
			return false;
	}

	return true;
}